

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  char *pcVar1;
  ulong uVar2;
  bool is_soo;
  int old_size;
  int iVar3;
  char *pcVar4;
  long lVar5;
  Arena *this_00;
  ShortSooRep *this_01;
  
  uVar2 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
  old_size = internal::SooRep::size((SooRep *)this,(uVar2 & 4) == 0);
  iVar3 = 0;
  if ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0) {
    iVar3 = (this->fields_).soo_rep_.field_0.long_rep.capacity;
  }
  if (old_size == iVar3) {
    RepeatedField<google::protobuf::UnknownField>::Grow
              (&this->fields_,(uVar2 & 4) == 0,old_size,old_size + 1);
  }
  else if ((uVar2 & 4) == 0) {
    pcVar4 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    is_soo = true;
    goto LAB_00260f34;
  }
  pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  is_soo = false;
LAB_00260f34:
  iVar3 = internal::SooRep::size((SooRep *)this,is_soo);
  if ((iVar3 != old_size + 1) &&
     ((undefined1  [16])((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
      != (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  RepeatedField<google::protobuf::UnknownField>::set_size(&this->fields_,is_soo,old_size + 1);
  lVar5 = (long)iVar3 * 0x10;
  *(int *)(pcVar4 + lVar5) = number;
  pcVar1 = pcVar4 + lVar5 + 4;
  pcVar1[0] = '\x04';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  this_00 = arena(this);
  if (this_00 == (Arena *)0x0) {
    this_01 = (ShortSooRep *)operator_new(0x10);
    this_01->arena_and_size = 0;
  }
  else {
    this_01 = (ShortSooRep *)Arena::Allocate(this_00,0x10);
    internal::ShortSooRep::ShortSooRep(this_01,this_00);
  }
  *(ShortSooRep **)(pcVar4 + lVar5 + 8) = this_01;
  return (UnknownFieldSet *)this_01;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group = Arena::Create<UnknownFieldSet>(arena());
  return field.data_.group;
}